

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O2

void read_hrd_parameters(h264_stream_t *h,bs_t *b)

{
  sps_t *psVar1;
  uint32_t uVar2;
  long lVar3;
  
  psVar1 = h->sps;
  uVar2 = bs_read_ue(b);
  (psVar1->hrd).cpb_cnt_minus1 = uVar2;
  uVar2 = bs_read_u(b,4);
  (psVar1->hrd).bit_rate_scale = uVar2;
  uVar2 = bs_read_u(b,4);
  (psVar1->hrd).cpb_size_scale = uVar2;
  for (lVar3 = 0; lVar3 <= (psVar1->hrd).cpb_cnt_minus1; lVar3 = lVar3 + 1) {
    uVar2 = bs_read_ue(b);
    (psVar1->hrd).bit_rate_value_minus1[lVar3] = uVar2;
    uVar2 = bs_read_ue(b);
    (psVar1->hrd).cpb_size_value_minus1[lVar3] = uVar2;
    uVar2 = bs_read_u1(b);
    (psVar1->hrd).cbr_flag[lVar3] = uVar2;
  }
  uVar2 = bs_read_u(b,5);
  (psVar1->hrd).initial_cpb_removal_delay_length_minus1 = uVar2;
  uVar2 = bs_read_u(b,5);
  (psVar1->hrd).cpb_removal_delay_length_minus1 = uVar2;
  uVar2 = bs_read_u(b,5);
  (psVar1->hrd).dpb_output_delay_length_minus1 = uVar2;
  uVar2 = bs_read_u(b,5);
  (psVar1->hrd).time_offset_length = uVar2;
  return;
}

Assistant:

void read_hrd_parameters(h264_stream_t* h, bs_t* b)
{
    sps_t* sps = h->sps;
    int SchedSelIdx;

    sps->hrd.cpb_cnt_minus1 = bs_read_ue(b);
    sps->hrd.bit_rate_scale = bs_read_u(b,4);
    sps->hrd.cpb_size_scale = bs_read_u(b,4);
    for( SchedSelIdx = 0; SchedSelIdx <= sps->hrd.cpb_cnt_minus1; SchedSelIdx++ )
    {
        sps->hrd.bit_rate_value_minus1[ SchedSelIdx ] = bs_read_ue(b);
        sps->hrd.cpb_size_value_minus1[ SchedSelIdx ] = bs_read_ue(b);
        sps->hrd.cbr_flag[ SchedSelIdx ] = bs_read_u1(b);
    }
    sps->hrd.initial_cpb_removal_delay_length_minus1 = bs_read_u(b,5);
    sps->hrd.cpb_removal_delay_length_minus1 = bs_read_u(b,5);
    sps->hrd.dpb_output_delay_length_minus1 = bs_read_u(b,5);
    sps->hrd.time_offset_length = bs_read_u(b,5);
}